

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
* __thiscall
CTxMemPool::CalculateChunksForRBF
          (Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
           *__return_storage_ptr__,CTxMemPool *this,CAmount replacement_fees,
          int64_t replacement_vsize,setEntries *direct_conflicts,setEntries *all_conflicts)

{
  CTxMemPoolEntry *pCVar1;
  pointer pFVar2;
  ulong uVar3;
  long lVar4;
  string original;
  int32_t iVar5;
  _Base_ptr p_Var6;
  size_type sVar7;
  long lVar8;
  long lVar9;
  FeeFrac *__args;
  setEntries *__range1;
  long in_FS_OFFSET;
  vector<FeeFrac,_std::allocator<FeeFrac>_> old_chunks;
  vector<FeeFrac,_std::allocator<FeeFrac>_> new_chunks;
  FeeFrac package;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_string;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffeb8;
  _Vector_base<FeeFrac,_std::allocator<FeeFrac>_> local_118;
  CAmount local_100;
  _Vector_base<FeeFrac,_std::allocator<FeeFrac>_> local_f8;
  FeeFrac local_e0;
  FeeFrac local_d0;
  string local_c0 [32];
  bilingual_str local_a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_100 = replacement_fees;
  CheckConflictTopology_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_60,this,direct_conflicts);
  if (local_60._M_engaged == true) {
    std::__cxx11::string::string
              (local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_60);
    original._M_string_length = replacement_vsize;
    original._M_dataplus._M_p = (pointer)__return_storage_ptr__;
    original.field_2 = in_stack_fffffffffffffeb8;
    Untranslated(&local_a0,original);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
    ::_Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
                *)__return_storage_ptr__,&local_a0);
    bilingual_str::~bilingual_str(&local_a0);
    std::__cxx11::string::~string(local_c0);
  }
  else {
    local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var6 = (all_conflicts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(all_conflicts->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
      pCVar1 = *(CTxMemPoolEntry **)(p_Var6 + 1);
      if ((ulong)pCVar1->m_count_with_descendants < 2) {
        pFVar2 = (pointer)pCVar1->m_modified_fee;
        iVar5 = CTxMemPoolEntry::GetTxSize(pCVar1);
        local_f8._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_f8._M_impl.super__Vector_impl_data._M_finish._4_4_,iVar5);
        local_f8._M_impl.super__Vector_impl_data._M_start = pFVar2;
        if ((ulong)pCVar1->m_count_with_ancestors < 2) {
          std::vector<FeeFrac,std::allocator<FeeFrac>>::emplace_back<FeeFrac&>
                    ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_118,(FeeFrac *)&local_f8);
        }
        else {
          local_d0.fee = pCVar1->nModFeesWithAncestors;
          local_d0.size = (int32_t)pCVar1->nSizeWithAncestors;
          lVar8 = SUB168(SEXT816((long)local_d0.size) * SEXT816((long)pFVar2),8);
          lVar9 = SUB168(SEXT816(local_d0.fee) * SEXT816((long)iVar5),8);
          uVar3 = (ulong)((ulong)(local_d0.fee * iVar5) <
                         (ulong)((long)local_d0.size * (long)pFVar2));
          lVar4 = lVar9 - lVar8;
          __args = &local_d0;
          if ((SBORROW8(lVar9,lVar8) != SBORROW8(lVar4,uVar3)) == (long)(lVar4 - uVar3) < 0) {
            local_e0.fee = local_d0.fee - (long)pFVar2;
            local_e0.size = local_d0.size - iVar5;
            std::vector<FeeFrac,_std::allocator<FeeFrac>_>::emplace_back<FeeFrac>
                      ((vector<FeeFrac,_std::allocator<FeeFrac>_> *)&local_118,&local_e0);
            __args = (FeeFrac *)&local_f8;
          }
          std::vector<FeeFrac,std::allocator<FeeFrac>>::emplace_back<FeeFrac&>
                    ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_118,__args);
        }
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<FeeFrac*,std::vector<FeeFrac,std::allocator<FeeFrac>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (local_118._M_impl.super__Vector_impl_data._M_start,
               local_118._M_impl.super__Vector_impl_data._M_finish);
    local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var6 = (direct_conflicts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(direct_conflicts->_M_t)._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
      if (*(long *)(*(long *)(p_Var6 + 1) + 0x38) != 0) {
        pCVar1 = *(CTxMemPoolEntry **)(*(long *)(*(long *)(p_Var6 + 1) + 0x28) + 0x20);
        local_d0.fee = (int64_t)pCVar1;
        sVar7 = std::
                set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                ::count(all_conflicts,(key_type *)&local_d0);
        if (sVar7 == 0) {
          local_d0.fee = pCVar1->m_modified_fee;
          iVar5 = CTxMemPoolEntry::GetTxSize(pCVar1);
          local_e0.fee = CONCAT44(local_e0.fee._4_4_,iVar5);
          std::vector<FeeFrac,std::allocator<FeeFrac>>::emplace_back<long,int>
                    ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_f8,&local_d0.fee,
                     (int *)&local_e0);
        }
      }
    }
    local_d0.fee = CONCAT44(local_d0.fee._4_4_,(int)replacement_vsize);
    std::vector<FeeFrac,std::allocator<FeeFrac>>::emplace_back<long&,int>
              ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_f8,&local_100,(int *)&local_d0);
    std::
    __sort<__gnu_cxx::__normal_iterator<FeeFrac*,std::vector<FeeFrac,std::allocator<FeeFrac>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (local_f8._M_impl.super__Vector_impl_data._M_start,
               local_f8._M_impl.super__Vector_impl_data._M_finish);
    std::
    pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>
    ::
    pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>_&,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_&,_true>
              ((pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>
                *)&stack0xfffffffffffffeb8,(vector<FeeFrac,_std::allocator<FeeFrac>_> *)&local_118,
               (vector<FeeFrac,_std::allocator<FeeFrac>_> *)&local_f8);
    std::__detail::__variant::
    _Variant_storage<false,bilingual_str,std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
    ::
    _Variant_storage<1ul,std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
              ((_Variant_storage<false,bilingual_str,std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
                *)__return_storage_ptr__,&stack0xfffffffffffffeb8);
    std::
    pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>
    ::~pair((pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>
             *)&stack0xfffffffffffffeb8);
    std::_Vector_base<FeeFrac,_std::allocator<FeeFrac>_>::~_Vector_base(&local_f8);
    std::_Vector_base<FeeFrac,_std::allocator<FeeFrac>_>::~_Vector_base(&local_118);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
            *)(_Variant_storage<false,bilingual_str,std::pair<std::vector<FeeFrac,std::allocator<FeeFrac>>,std::vector<FeeFrac,std::allocator<FeeFrac>>>>
               *)__return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<std::pair<std::vector<FeeFrac>, std::vector<FeeFrac>>> CTxMemPool::CalculateChunksForRBF(CAmount replacement_fees, int64_t replacement_vsize, const setEntries& direct_conflicts, const setEntries& all_conflicts)
{
    Assume(replacement_vsize > 0);

    auto err_string{CheckConflictTopology(direct_conflicts)};
    if (err_string.has_value()) {
        // Unsupported topology for calculating a feerate diagram
        return util::Error{Untranslated(err_string.value())};
    }

    // new diagram will have chunks that consist of each ancestor of
    // direct_conflicts that is at its own fee/size, along with the replacement
    // tx/package at its own fee/size

    // old diagram will consist of the ancestors and descendants of each element of
    // all_conflicts.  every such transaction will either be at its own feerate (followed
    // by any descendant at its own feerate), or as a single chunk at the descendant's
    // ancestor feerate.

    std::vector<FeeFrac> old_chunks;
    // Step 1: build the old diagram.

    // The above clusters are all trivially linearized;
    // they have a strict topology of 1 or two connected transactions.

    // OLD: Compute existing chunks from all affected clusters
    for (auto txiter : all_conflicts) {
        // Does this transaction have descendants?
        if (txiter->GetCountWithDescendants() > 1) {
            // Consider this tx when we consider the descendant.
            continue;
        }
        // Does this transaction have ancestors?
        FeeFrac individual{txiter->GetModifiedFee(), txiter->GetTxSize()};
        if (txiter->GetCountWithAncestors() > 1) {
            // We'll add chunks for either the ancestor by itself and this tx
            // by itself, or for a combined package.
            FeeFrac package{txiter->GetModFeesWithAncestors(), static_cast<int32_t>(txiter->GetSizeWithAncestors())};
            if (individual >> package) {
                // The individual feerate is higher than the package, and
                // therefore higher than the parent's fee. Chunk these
                // together.
                old_chunks.emplace_back(package);
            } else {
                // Add two points, one for the parent and one for this child.
                old_chunks.emplace_back(package - individual);
                old_chunks.emplace_back(individual);
            }
        } else {
            old_chunks.emplace_back(individual);
        }
    }

    // No topology restrictions post-chunking; sort
    std::sort(old_chunks.begin(), old_chunks.end(), std::greater());

    std::vector<FeeFrac> new_chunks;

    /* Step 2: build the NEW diagram
     * CON = Conflicts of proposed chunk
     * CNK = Proposed chunk
     * NEW = OLD - CON + CNK: New diagram includes all chunks in OLD, minus
     * the conflicts, plus the proposed chunk
     */

    // OLD - CON: Add any parents of direct conflicts that are not conflicted themselves
    for (auto direct_conflict : direct_conflicts) {
        // If a direct conflict has an ancestor that is not in all_conflicts,
        // it can be affected by the replacement of the child.
        if (direct_conflict->GetMemPoolParentsConst().size() > 0) {
            // Grab the parent.
            const CTxMemPoolEntry& parent = direct_conflict->GetMemPoolParentsConst().begin()->get();
            if (!all_conflicts.count(mapTx.iterator_to(parent))) {
                // This transaction would be left over, so add to the NEW
                // diagram.
                new_chunks.emplace_back(parent.GetModifiedFee(), parent.GetTxSize());
            }
        }
    }
    // + CNK: Add the proposed chunk itself
    new_chunks.emplace_back(replacement_fees, int32_t(replacement_vsize));

    // No topology restrictions post-chunking; sort
    std::sort(new_chunks.begin(), new_chunks.end(), std::greater());
    return std::make_pair(old_chunks, new_chunks);
}